

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TubeResonator.cpp
# Opt level: O0

void __thiscall TubeResonator::Delay::Process(Delay *this)

{
  uint uVar1;
  float x;
  float s2;
  float s1;
  int r;
  float f;
  Delay *this_local;
  
  this->data[this->writepos] = this->input;
  x = (float)(this->writepos + 0xff) - this->delay;
  uVar1 = FastFloor(x);
  this->writepos = this->writepos + 1U & 0xff;
  this->output = (this->data[(int)((uVar1 & 0xff) + 1 & 0xff)] - this->data[(int)(uVar1 & 0xff)]) *
                 (x - (float)(int)uVar1) + this->data[(int)(uVar1 & 0xff)];
  return;
}

Assistant:

inline void Process()
        {
            data[writepos] = input;
            float f = writepos + MASK - delay;
            int r = FastFloor(f);
            f -= r;
            r &= MASK;
            writepos = (writepos + 1) & MASK;
            float s1 = data[r & MASK];
            float s2 = data[(r + 1) & MASK];
            output = s1 + (s2 - s1) * f;
        }